

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

bool ThreadContext::IsCurrentStackAvailable(size_t size)

{
  code *pcVar1;
  bool bVar2;
  ThreadContextTLSEntry *this;
  ThreadContext *this_00;
  undefined4 *puVar3;
  
  this = ThreadContextTLSEntry::GetEntryForCurrentThread();
  if (this == (ThreadContextTLSEntry *)0x0) {
    this_00 = (ThreadContext *)0x0;
  }
  else {
    this_00 = ThreadContextTLSEntry::GetThreadContext(this);
  }
  if (this_00 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x67b,"(currentContext)","currentContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = IsStackAvailable(this_00,size,(bool *)0x0);
  return bVar2;
}

Assistant:

bool
ThreadContext::IsCurrentStackAvailable(size_t size)
{
    ThreadContext *currentContext = GetContextForCurrentThread();
    Assert(currentContext);

    return currentContext->IsStackAvailable(size);
}